

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O3

size_t prt_moves(wchar_t row,wchar_t col)

{
  wchar_t wVar1;
  wchar_t wVar2;
  char *pcVar3;
  
  wVar1 = (player->state).num_moves;
  if (wVar1 < L'\x01') {
    if (L'\xffffffff' < wVar1) {
      return 0;
    }
    wVar2 = -wVar1;
    pcVar3 = "Moves -%d ";
  }
  else {
    pcVar3 = "Moves +%d ";
    wVar2 = wVar1;
  }
  pcVar3 = format(pcVar3,(ulong)(uint)wVar2);
  c_put_str('\x16',pcVar3,row,col);
  wVar2 = -wVar1;
  if (L'\0' < wVar1) {
    wVar2 = wVar1;
  }
  return (ulong)((uint)wVar2 / 10 + 9);
}

Assistant:

static size_t prt_moves(int row, int col)
{
	int i = player->state.num_moves;

	/* 1 move is normal and requires no display */
	if (i > 0) {
		/* Display the number of moves */
		c_put_str(COLOUR_L_TEAL, format("Moves +%d ", i), row, col);
	} else if (i < 0) {
		/* Display the number of moves */
		c_put_str(COLOUR_L_TEAL, format("Moves -%d ", ABS(i)), row, col);
	}

	/* Shouldn't be double digits, but be paranoid */
	return (i != 0) ? (9 + ABS(i) / 10) : 0;
}